

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::Skip(CopyingInputStreamAdaptor *this,int count)

{
  int iVar1;
  uint uVar2;
  string *psVar3;
  bool bVar4;
  LogMessageFatal local_20 [16];
  
  psVar3 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(count,0,"count >= 0");
  if (psVar3 == (string *)0x0) {
    if (this->failed_ == false) {
      iVar1 = this->backup_bytes_;
      if (iVar1 < count) {
        this->backup_bytes_ = 0;
        uVar2 = (*this->copying_stream_->_vptr_CopyingInputStream[3])
                          (this->copying_stream_,(ulong)(uint)(count - iVar1));
        this->position_ = this->position_ + (long)(int)uVar2;
        bVar4 = uVar2 == count - iVar1;
      }
      else {
        this->backup_bytes_ = iVar1 - count;
        bVar4 = true;
      }
    }
    else {
      bVar4 = false;
    }
    return bVar4;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0xf0,psVar3->_M_string_length,(psVar3->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

bool CopyingInputStreamAdaptor::Skip(int count) {
  ABSL_CHECK_GE(count, 0);

  if (failed_) {
    // Already failed on a previous read.
    return false;
  }

  // First skip any bytes left over from a previous BackUp().
  if (backup_bytes_ >= count) {
    // We have more data left over than we're trying to skip.  Just chop it.
    backup_bytes_ -= count;
    return true;
  }

  count -= backup_bytes_;
  backup_bytes_ = 0;

  int skipped = copying_stream_->Skip(count);
  position_ += skipped;
  return skipped == count;
}